

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.h
# Opt level: O0

void av1_set_mv_row_limits
               (CommonModeInfoParams *mi_params,FullMvLimits *mv_limits,int mi_row,int mi_height,
               int border)

{
  int iVar1;
  int local_34;
  int local_30;
  int max2;
  int max1;
  int min2;
  int min1;
  int border_local;
  int mi_height_local;
  int mi_row_local;
  FullMvLimits *mv_limits_local;
  CommonModeInfoParams *mi_params_local;
  
  iVar1 = -(mi_row * 4 + border + -8);
  local_30 = -((mi_row + mi_height) * 4 + 8);
  if (local_30 < iVar1) {
    local_30 = iVar1;
  }
  mv_limits->row_min = local_30;
  iVar1 = ((mi_params->mi_rows - mi_row) - mi_height) * 4 + border + -8;
  local_34 = (mi_params->mi_rows - mi_row) * 4 + 8;
  if (iVar1 < local_34) {
    local_34 = iVar1;
  }
  mv_limits->row_max = local_34;
  return;
}

Assistant:

static inline void av1_set_mv_row_limits(
    const CommonModeInfoParams *const mi_params, FullMvLimits *mv_limits,
    int mi_row, int mi_height, int border) {
  const int min1 = -(mi_row * MI_SIZE + border - 2 * AOM_INTERP_EXTEND);
  const int min2 = -(((mi_row + mi_height) * MI_SIZE) + 2 * AOM_INTERP_EXTEND);
  mv_limits->row_min = AOMMAX(min1, min2);
  const int max1 = (mi_params->mi_rows - mi_row - mi_height) * MI_SIZE +
                   border - 2 * AOM_INTERP_EXTEND;
  const int max2 =
      (mi_params->mi_rows - mi_row) * MI_SIZE + 2 * AOM_INTERP_EXTEND;
  mv_limits->row_max = AOMMIN(max1, max2);
}